

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusinputcontextproxy.h
# Opt level: O0

QDBusPendingReply<> * __thiscall
QIBusInputContextProxy::SetCursorLocationRelative
          (QIBusInputContextProxy *this,int x,int y,int w,int h)

{
  QArrayDataPointer<char16_t> *this_00;
  QList<QVariant> *value;
  QList_conflict *in_RSI;
  DataPointer *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  QList<QVariant> argumentList;
  QList<QVariant> *in_stack_fffffffffffffe80;
  int *in_stack_fffffffffffffe88;
  QArrayDataPointer<char16_t> local_f0 [2];
  QDBusPendingCall local_c0 [8];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = 0xaaaaaaaaaaaaaaaa;
  local_b8 = 0xaaaaaaaaaaaaaaaa;
  uStack_b0 = 0xaaaaaaaaaaaaaaaa;
  QList<QVariant>::QList((QList<QVariant> *)0x10f4ad);
  QVariant::fromValue<int>(in_stack_fffffffffffffe88);
  this_00 = (QArrayDataPointer<char16_t> *)
            QList<QVariant>::operator<<(in_stack_fffffffffffffe80,(rvalue_ref)in_RDI);
  QVariant::fromValue<int>(in_stack_fffffffffffffe88);
  value = QList<QVariant>::operator<<((QList<QVariant> *)this_00,(rvalue_ref)in_RDI);
  QVariant::fromValue<int>((int *)value);
  QList<QVariant>::operator<<((QList<QVariant> *)this_00,(rvalue_ref)in_RDI);
  QVariant::fromValue<int>((int *)value);
  QList<QVariant>::operator<<((QList<QVariant> *)this_00,(rvalue_ref)in_RDI);
  QVariant::~QVariant(&local_88);
  QVariant::~QVariant(&local_68);
  QVariant::~QVariant(&local_48);
  QVariant::~QVariant(&local_28);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (local_f0,(Data *)0x0,L"SetCursorLocationRelative",0x19);
  QString::QString((QString *)this_00,in_RDI);
  QDBusAbstractInterface::asyncCallWithArgumentList((QString *)local_c0,in_RSI);
  QDBusPendingReply<>::QDBusPendingReply((QDBusPendingReply<> *)this_00,(QDBusPendingCall *)in_RDI);
  QDBusPendingCall::~QDBusPendingCall(local_c0);
  QString::~QString((QString *)0x10f62d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  QList<QVariant>::~QList((QList<QVariant> *)0x10f641);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDBusPendingReply<> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusPendingReply<> SetCursorLocationRelative(int x, int y, int w, int h)
    {
        QList<QVariant> argumentList;
        argumentList << QVariant::fromValue(x) << QVariant::fromValue(y) << QVariant::fromValue(w) << QVariant::fromValue(h);
        return asyncCallWithArgumentList(QStringLiteral("SetCursorLocationRelative"), argumentList);
    }